

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Char * poolAppend(STRING_POOL *pool,ENCODING *enc,char *ptr,char *end)

{
  int iVar1;
  char *local_38;
  
  local_38 = ptr;
  if ((pool->ptr != (XML_Char *)0x0) || (iVar1 = poolGrow(pool), iVar1 != 0)) {
    do {
      (*enc->utf8Convert)(enc,&local_38,end,&pool->ptr,pool->end);
      if (local_38 == end) {
        return pool->start;
      }
      iVar1 = poolGrow(pool);
    } while (iVar1 != 0);
  }
  return (XML_Char *)0x0;
}

Assistant:

static
XML_Char *poolAppend(STRING_POOL *pool, const ENCODING *enc,
                     const char *ptr, const char *end)
{
  if (!pool->ptr && !poolGrow(pool))
    return 0;
  for (;;) {
    XmlConvert(enc, &ptr, end, (ICHAR **)&(pool->ptr), (ICHAR *)pool->end);
    if (ptr == end)
      break;
    if (!poolGrow(pool))
      return 0;
  }
  return pool->start;
}